

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O2

void __thiscall
CountFailureRepr::CountFailureRepr
          (CountFailureRepr *this,shared_ptr<const_oout::CountFailure> *count)

{
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__CountFailureRepr_001cbb88;
  std::__shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->count).super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>
             ,&count->super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

CountFailureRepr::CountFailureRepr(const shared_ptr<const CountFailure> &count)
	: count(count)
{
}